

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

bool __thiscall AActor::FixMapthingPos(AActor *this)

{
  double *pdVar1;
  sector_t *psVar2;
  sector_t *psVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  sector_t *psVar7;
  undefined4 extraout_var;
  char *pcVar8;
  bool bVar9;
  uint uVar10;
  undefined8 in_R9;
  line_t *plVar11;
  int *piVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined8 uVar18;
  
  dVar14 = (this->__Pos).X;
  dVar16 = (this->__Pos).Y;
  psVar7 = P_PointInSectorBuggy(dVar14,dVar16);
  uVar5 = (uint)((dVar14 - bmaporgx) * 0.0078125);
  bVar9 = false;
  if ((uVar5 < (uint)bmapwidth) &&
     (uVar10 = (uint)((dVar16 - bmaporgy) * 0.0078125), uVar10 < (uint)bmapheight)) {
    iVar6 = blockmaplump[(long)blockmap[(int)(bmapwidth * uVar10 + uVar5)] + 1];
    if (iVar6 == -1) {
      bVar9 = false;
    }
    else {
      piVar12 = blockmaplump + (long)blockmap[(int)(bmapwidth * uVar10 + uVar5)] + 2;
      bVar9 = false;
      do {
        psVar2 = lines[iVar6].frontsector;
        psVar3 = lines[iVar6].backsector;
        if (psVar2 != psVar3) {
          if (psVar3 != (sector_t *)0x0) {
            dVar14 = (psVar2->floorplane).normal.X;
            if ((((dVar14 != (psVar3->floorplane).normal.X) ||
                 (NAN(dVar14) || NAN((psVar3->floorplane).normal.X))) ||
                (dVar14 = (psVar2->floorplane).normal.Y, pdVar1 = &(psVar3->floorplane).normal.Y,
                dVar14 != *pdVar1)) || (NAN(dVar14) || NAN(*pdVar1))) {
              bVar4 = false;
            }
            else {
              bVar4 = (psVar3->floorplane).normal.Z == (psVar2->floorplane).normal.Z;
            }
            if (bVar4) {
              dVar14 = (psVar2->floorplane).D;
              pdVar1 = &(psVar3->floorplane).D;
              if ((dVar14 == *pdVar1) && (!NAN(dVar14) && !NAN(*pdVar1))) {
                dVar14 = (psVar2->ceilingplane).normal.X;
                if (((dVar14 != (psVar3->ceilingplane).normal.X) ||
                    ((NAN(dVar14) || NAN((psVar3->ceilingplane).normal.X) ||
                     (dVar14 = (psVar2->ceilingplane).normal.Y,
                     pdVar1 = &(psVar3->ceilingplane).normal.Y, dVar14 != *pdVar1)))) ||
                   (NAN(dVar14) || NAN(*pdVar1))) {
                  bVar4 = false;
                }
                else {
                  bVar4 = (psVar3->ceilingplane).normal.Z == (psVar2->ceilingplane).normal.Z;
                }
                if (bVar4) {
                  dVar14 = (psVar2->ceilingplane).D;
                  pdVar1 = &(psVar3->ceilingplane).D;
                  if ((dVar14 == *pdVar1) && (!NAN(dVar14) && !NAN(*pdVar1))) goto LAB_0051a9e3;
                }
              }
            }
          }
          plVar11 = lines + iVar6;
          dVar14 = (this->__Pos).X;
          dVar16 = this->radius;
          if ((plVar11->bbox[2] < dVar14 + dVar16) &&
             (((dVar14 - dVar16 < plVar11->bbox[3] &&
               (dVar14 = (this->__Pos).Y, plVar11->bbox[1] < dVar16 + dVar14)) &&
              (dVar14 - dVar16 < plVar11->bbox[0])))) {
            dVar14 = (plVar11->delta).X;
            dVar16 = (plVar11->delta).Y;
            dVar13 = c_sqrt(dVar16 * dVar16 + dVar14 * dVar14);
            dVar14 = (plVar11->delta).X;
            dVar16 = (plVar11->delta).Y;
            dVar17 = (dVar14 / dVar13) * dVar14 + (dVar16 / dVar13) * dVar16;
            dVar13 = 0.0;
            if ((dVar17 != 0.0) || (NAN(dVar17))) {
              dVar13 = (dVar14 * ((this->__Pos).Y - (plVar11->v1->p).Y) +
                       dVar16 * ((plVar11->v1->p).X - (this->__Pos).X)) / dVar17;
            }
            dVar13 = ABS(dVar13);
            if (dVar13 < this->radius) {
              uVar18 = 0;
              if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                iVar6 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
                (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
              }
              dVar14 = (plVar11->delta).X;
              pcVar8 = "vertical";
              if ((dVar14 != 0.0) || (NAN(dVar14))) {
                pdVar1 = &(plVar11->delta).Y;
                pcVar8 = "horizontal";
                if (*pdVar1 != 0.0) {
                  pcVar8 = "diagonal";
                }
                if (NAN(*pdVar1)) {
                  pcVar8 = "diagonal";
                }
              }
              DPrintf(3,"%s at (%f,%f) lies on %s line %td, distance = %f\n",(this->__Pos).X,
                      (this->__Pos).Y,dVar13,
                      FName::NameData.NameArray
                      [(((this->super_DThinker).super_DObject.Class)->super_PStruct).
                       super_PNamedType.TypeName.Index].Text,pcVar8,
                      ((long)plVar11 - (long)lines >> 3) * -0x79435e50d79435e5,in_R9,dVar13,uVar18);
              dVar14 = c_atan2((plVar11->delta).Y,(plVar11->delta).X);
              if (plVar11->backsector == (sector_t *)0x0) {
                dVar16 = -90.0;
              }
              else {
                dVar16 = *(double *)(&DAT_0073d880 + (ulong)(plVar11->backsector == psVar7) * 8);
              }
              dVar13 = this->radius - dVar13;
              dVar17 = (this->__Pos).X;
              dVar15 = (this->__Pos).Y;
              dVar14 = FFastTrig::cos(&fasttrig,
                                      (dVar14 * 57.29577951308232 + dVar16) * 11930464.711111112 +
                                      6755399441055744.0);
              dVar17 = dVar14 * dVar13 + dVar17;
              dVar14 = FFastTrig::sin(&fasttrig,dVar17);
              dVar15 = dVar14 * dVar13 + dVar15;
              (this->__Pos).X = dVar17;
              (this->__Pos).Y = dVar15;
              (this->Prev).Z = (this->__Pos).Z;
              (this->Prev).Y = dVar15;
              (this->Prev).X = dVar17;
              (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
              dVar14 = (this->Angles).Yaw.Degrees;
              (this->PrevAngles).Pitch.Degrees = (this->Angles).Pitch.Degrees;
              (this->PrevAngles).Yaw.Degrees = dVar14;
              if (this->Sector == (sector_t *)0x0) {
                this->PrevPortalGroup = 0;
              }
              else {
                this->PrevPortalGroup = this->Sector->PortalGroup;
              }
              bVar9 = true;
            }
          }
        }
LAB_0051a9e3:
        iVar6 = *piVar12;
        piVar12 = piVar12 + 1;
      } while (iVar6 != -1);
    }
  }
  return bVar9;
}

Assistant:

bool AActor::FixMapthingPos()
{
	sector_t *secstart = P_PointInSectorBuggy(X(), Y());

	int blockx = GetBlockX(X());
	int blocky = GetBlockY(Y());
	bool success = false;

	if ((unsigned int)blockx < (unsigned int)bmapwidth &&
		(unsigned int)blocky < (unsigned int)bmapheight)
	{
		int *list;

		for (list = blockmaplump + blockmap[blocky*bmapwidth + blockx] + 1; *list != -1; ++list)
		{
			line_t *ldef = &lines[*list];

			if (ldef->frontsector == ldef->backsector)
			{ // Skip two-sided lines inside a single sector
				continue;
			}
			if (ldef->backsector != NULL)
			{
				if (ldef->frontsector->floorplane == ldef->backsector->floorplane &&
					ldef->frontsector->ceilingplane == ldef->backsector->ceilingplane)
				{ // Skip two-sided lines without any height difference on either side
					continue;
				}
			}

			// Not inside the line's bounding box
			if (X() + radius <= ldef->bbox[BOXLEFT]
				|| X() - radius >= ldef->bbox[BOXRIGHT]
				|| Y() + radius <= ldef->bbox[BOXBOTTOM]
				|| Y() - radius >= ldef->bbox[BOXTOP])
				continue;

			// Get the exact distance to the line
			divline_t dll, dlv;
			double linelen = ldef->Delta().Length();

			P_MakeDivline(ldef, &dll);

			dlv.x = X();
			dlv.y = Y();
			dlv.dx = dll.dy / linelen;
			dlv.dy = -dll.dx / linelen;

			double distance = fabs(P_InterceptVector(&dlv, &dll));

			if (distance < radius)
			{
				DPrintf(DMSG_NOTIFY, "%s at (%f,%f) lies on %s line %td, distance = %f\n",
					this->GetClass()->TypeName.GetChars(), X(), Y(),
					ldef->Delta().X == 0 ? "vertical" : ldef->Delta().Y == 0 ? "horizontal" : "diagonal",
					ldef - lines, distance);
				DAngle ang = ldef->Delta().Angle();
				if (ldef->backsector != NULL && ldef->backsector == secstart)
				{
					ang += 90.;
				}
				else
				{
					ang -= 90.;
				}

				// Get the distance we have to move the object away from the wall
				distance = radius - distance;
				SetXY(Pos().XY() + ang.ToVector(distance));
				ClearInterpolation();
				success = true;
			}
		}
	}
	return success;
}